

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

CompilerCPP * __thiscall
spirv_cross::CompilerCPP::variable_decl
          (CompilerCPP *this,SPIRType *type,string *name,uint32_t param_3)

{
  ulong uVar1;
  size_t sVar2;
  bool *pbVar3;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  undefined1 local_b0 [64];
  uint *local_70;
  uint *array;
  char local_5d;
  uint32_t i;
  bool runtime;
  string local_50 [8];
  string base;
  uint32_t param_3_local;
  string *name_local;
  SPIRType *type_local;
  CompilerCPP *this_local;
  
  (*(type->super_IVariant)._vptr_IVariant[0x13])(local_50,type,name,0);
  Compiler::remap_variable_type_name
            ((Compiler *)type,(SPIRType *)name,(string *)CONCAT44(in_register_0000000c,param_3),
             local_50);
  local_5d = '\0';
  for (array._4_4_ = 0; uVar1 = (ulong)array._4_4_,
      sVar2 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(name + 0x20)),
      uVar1 < sVar2; array._4_4_ = array._4_4_ + 1) {
    local_70 = VectorView<unsigned_int>::operator[]
                         ((VectorView<unsigned_int> *)(name + 0x20),(ulong)array._4_4_);
    if ((*local_70 == 0) &&
       (pbVar3 = VectorView<bool>::operator[]((VectorView<bool> *)(name + 0x58),(ulong)array._4_4_),
       (*pbVar3 & 1U) != 0)) {
      local_5d = '\x01';
    }
    else {
      CompilerGLSL::to_array_size_abi_cxx11_((CompilerGLSL *)local_b0,type,(uint32_t)name);
      join<char_const(&)[12],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)(local_b0 + 0x20),(char (*) [12])"std::array<",local_50,
                 (char (*) [3])0x5cb8ef,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 (char (*) [2])0x5baa5d);
      ::std::__cxx11::string::operator=((string *)local_50,(string *)(local_b0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_b0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_b0);
    }
  }
  ::std::__cxx11::string::operator+=((string *)local_50,' ');
  ::std::operator+(local_d0,local_50);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_d0);
  ::std::__cxx11::string::~string((string *)local_d0);
  ::std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

string CompilerCPP::variable_decl(const SPIRType &type, const string &name, uint32_t /* id */)
{
	string base = type_to_glsl(type);
	remap_variable_type_name(type, name, base);
	bool runtime = false;

	for (uint32_t i = 0; i < type.array.size(); i++)
	{
		auto &array = type.array[i];
		if (!array && type.array_size_literal[i])
		{
			// Avoid using runtime arrays with std::array since this is undefined.
			// Runtime arrays cannot be passed around as values, so this is fine.
			runtime = true;
		}
		else
			base = join("std::array<", base, ", ", to_array_size(type, i), ">");
	}
	base += ' ';
	return base + name + (runtime ? "[1]" : "");
}